

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarData.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
license::locate::EnvironmentVarData::license_locations_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,EnvironmentVarData *this,EventRegistry *eventRegistry)

{
  char *pcVar1;
  FILE_FORMAT FVar2;
  allocator local_89;
  value_type local_88;
  allocator local_61;
  string local_60;
  FILE_FORMAT local_40;
  FILE_FORMAT licenseFormat;
  char *local_30;
  char *env_var_value;
  EventRegistry *local_20;
  EventRegistry *eventRegistry_local;
  EnvironmentVarData *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *diskFiles;
  
  env_var_value._7_1_ = 0;
  local_20 = eventRegistry;
  eventRegistry_local = (EventRegistry *)this;
  this_local = (EnvironmentVarData *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  local_30 = getenv("LICENSE_DATA");
  if ((local_30 == (char *)0x0) || (*local_30 == '\0')) {
    EventRegistry::addEvent
              (local_20,ENVIRONMENT_VARIABLE_NOT_DEFINED,"LICENSE_LOCATION",(char *)0x0);
  }
  else {
    EventRegistry::addEvent(local_20,LICENSE_SPECIFIED,"LICENSE_LOCATION",(char *)0x0);
    pcVar1 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,pcVar1,&local_61);
    FVar2 = identify_format(&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    local_40 = FVar2;
    if (FVar2 == UNKNOWN) {
      EventRegistry::addEvent(local_20,HV,"LICENSE_LOCATION",(char *)0x0);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_88,"LICENSE_LOCATION",&local_89);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      this->isBase64 = local_40 == BASE64;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const vector<string> EnvironmentVarData::license_locations(EventRegistry &eventRegistry) {
	vector<string> diskFiles;
	char *env_var_value = getenv(LCC_LICENSE_DATA_ENV_VAR);
	if (env_var_value != nullptr && env_var_value[0] != '\0') {
		eventRegistry.addEvent(LICENSE_SPECIFIED, LCC_LICENSE_LOCATION_ENV_VAR);
		FILE_FORMAT licenseFormat = identify_format(env_var_value);
		if (licenseFormat == UNKNOWN) {
			eventRegistry.addEvent(LICENSE_MALFORMED, LCC_LICENSE_LOCATION_ENV_VAR);
		} else {
			diskFiles.push_back(LCC_LICENSE_LOCATION_ENV_VAR);
			isBase64 = (licenseFormat == BASE64);
		}
	} else {
		eventRegistry.addEvent(ENVIRONMENT_VARIABLE_NOT_DEFINED, LCC_LICENSE_LOCATION_ENV_VAR);
	}
	return diskFiles;
}